

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::Id_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
eval_internal(Id_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this,
             Dispatch_State *t_ss)

{
  size_t in_RDX;
  Boxed_Value BVar1;
  string_view t_name;
  
  t_name._M_str = &((t_ss->m_conversions).m_saves._M_data)->enabled;
  t_name._M_len = in_RDX;
  BVar1 = chaiscript::detail::Dispatch_State::get_object
                    ((Dispatch_State *)this,t_name,
                     (atomic_uint_fast32_t *)(t_ss->m_conversions).m_conversions._M_data);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        try {
          return t_ss.get_object(this->text, m_loc);
        } catch (std::exception &) {
          throw exception::eval_error("Can not find object: " + this->text);
        }
      }